

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O1

Value __thiscall
MiniScript::Parser::ParseAddSub(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  bool *pbVar1;
  long *plVar2;
  int iVar3;
  ParseState *this_00;
  Value *pVVar4;
  bool bVar5;
  undefined7 in_register_00000011;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX_02;
  anon_union_8_3_2f476f46_for_data extraout_RDX_03;
  anon_union_8_3_2f476f46_for_data aVar6;
  anon_union_8_3_2f476f46_for_data extraout_RDX_04;
  undefined4 in_R8D;
  Value VVar7;
  Value opB;
  Token tok;
  undefined1 local_170 [8];
  ListStorage<MiniScript::BackPatch> *local_168;
  ListStorage<MiniScript::ParseState> *local_160;
  Value local_158;
  bool local_148 [8];
  ParseState *local_140;
  undefined4 local_134;
  Value local_130;
  Token local_120;
  Value local_100;
  Lexer local_f0;
  Token local_e8;
  Value *local_c8;
  Lexer local_c0;
  Lexer local_b8;
  TACLine local_b0;
  Token local_50;
  
  local_160 = (ListStorage<MiniScript::ParseState> *)CONCAT71(in_register_00000011,asLval);
  local_f0.ls = (LexerStorage *)(local_160->super_RefCountedStorage)._vptr_RefCountedStorage;
  if (local_f0.ls != (LexerStorage *)0x0) {
    (local_f0.ls)->refCount = (local_f0.ls)->refCount + 1;
  }
  local_134 = in_R8D;
  ParseMultDiv(this,tokens,SUB81(&local_f0,0),statementStart);
  local_c8 = (Value *)tokens;
  Lexer::release(&local_f0);
  Lexer::Peek(&local_e8,(Lexer *)local_160);
  aVar6 = extraout_RDX;
  while ((local_e8.type == OpPlus ||
         ((local_e8.type == OpMinus &&
          ((((char)local_134 == '\0' || (local_e8.afterSpace != true)) ||
           (bVar5 = Lexer::isAtWhitespace((Lexer *)local_160), aVar6 = extraout_RDX_00, bVar5)))))))
  {
    Lexer::Dequeue(&local_50,(Lexer *)local_160);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar2 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_b8.ls = (LexerStorage *)(local_160->super_RefCountedStorage)._vptr_RefCountedStorage;
    if (local_b8.ls != (LexerStorage *)0x0) {
      (local_b8.ls)->refCount = (local_b8.ls)->refCount + 1;
    }
    AllowLineBreak(&local_b8);
    Lexer::release(&local_b8);
    local_148[0] = *(bool *)&(this->errorContext).ss;
    local_148[1] = *(bool *)((long)&(this->errorContext).ss + 1);
    local_148[2] = *(bool *)((long)&(this->errorContext).ss + 2);
    local_140 = *(ParseState **)&(this->errorContext).isTemp;
    if ((2 < local_148[0]) && (local_140 != (ParseState *)0x0)) {
      pbVar1 = &(local_140->code).isTemp;
      *(long *)pbVar1 = *(long *)pbVar1 + 1;
    }
    FullyEvaluate((Parser *)local_170,local_c8,(LocalOnlyMode)local_148);
    Value::operator=((Value *)this,(Value *)local_170);
    if ((2 < local_170[0]) && (local_168 != (ListStorage<MiniScript::BackPatch> *)0x0)) {
      plVar2 = &(local_168->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_168->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_168 = (ListStorage<MiniScript::BackPatch> *)0x0;
    }
    if ((2 < local_148[0]) && (local_140 != (ParseState *)0x0)) {
      pbVar1 = &(local_140->code).isTemp;
      *(long *)pbVar1 = *(long *)pbVar1 + -1;
      if (*(long *)pbVar1 == 0) {
        (*(code *)(((local_140->code).ls)->super_RefCountedStorage).refCount)();
      }
      local_140 = (ParseState *)0x0;
    }
    pVVar4 = local_c8;
    local_c0.ls = (LexerStorage *)(local_160->super_RefCountedStorage)._vptr_RefCountedStorage;
    if (local_c0.ls != (LexerStorage *)0x0) {
      (local_c0.ls)->refCount = (local_c0.ls)->refCount + 1;
    }
    ParseMultDiv((Parser *)local_170,(Lexer *)local_c8,SUB81(&local_c0,0),false);
    Lexer::release(&local_c0);
    this_00 = *(ParseState **)(pVVar4 + 3);
    iVar3 = this_00->nextTempNum;
    this_00->nextTempNum = iVar3 + 1;
    local_100.type = Temp;
    local_100.noInvoke = false;
    local_100.localOnly = Off;
    local_100.data.tempNum = iVar3;
    local_158.type = *(ValueType *)&(this->errorContext).ss;
    local_158.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
    local_158.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
    local_158.data =
         (anon_union_8_3_2f476f46_for_data)
         *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
    if ((2 < local_158.type) && ((StringStorage *)local_158.data.ref != (StringStorage *)0x0)) {
      (local_158.data.ref)->refCount = (local_158.data.ref)->refCount + 1;
    }
    local_130.type = local_170[0];
    local_130.noInvoke = (bool)local_170[1];
    local_130.localOnly = local_170[2];
    local_130.data.ref = &local_168->super_RefCountedStorage;
    if ((2 < local_170[0]) && (local_168 != (ListStorage<MiniScript::BackPatch> *)0x0)) {
      plVar2 = &(local_168->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + 1;
    }
    TACLine::TACLine(&local_b0,&local_100,(local_e8.type != OpPlus) + APlusB,&local_158,&local_130);
    ParseState::Add(this_00,&local_b0);
    if ((local_b0.location.context.ss != (StringStorage *)0x0) &&
       (local_b0.location.context.isTemp == false)) {
      plVar2 = &((local_b0.location.context.ss)->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((local_b0.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.location.context.ss = (StringStorage *)0x0;
    }
    if ((local_b0.comment.ss != (StringStorage *)0x0) && (local_b0.comment.isTemp == false)) {
      plVar2 = &((local_b0.comment.ss)->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((local_b0.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.comment.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_b0.rhsB.type) && (local_b0.rhsB.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_b0.rhsB.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_b0.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.rhsB.data.number = 0.0;
    }
    if ((Temp < local_b0.rhsA.type) && (local_b0.rhsA.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_b0.rhsA.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_b0.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.rhsA.data.number = 0.0;
    }
    if ((Temp < local_b0.lhs.type) && (local_b0.lhs.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_b0.lhs.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_b0.lhs.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.lhs.data.number = 0.0;
    }
    if ((2 < local_130.type) &&
       ((ListStorage<MiniScript::BackPatch> *)local_130.data.ref !=
        (ListStorage<MiniScript::BackPatch> *)0x0)) {
      plVar2 = &(local_130.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((RefCountedStorage *)&(local_130.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_130.data.number = 0.0;
    }
    if ((2 < local_158.type) && ((StringStorage *)local_158.data.ref != (StringStorage *)0x0)) {
      plVar2 = &(local_158.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((RefCountedStorage *)&(local_158.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    if ((Temp < local_100.type) && (local_100.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_100.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_100.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_100.data.number = 0.0;
    }
    local_120.type = CONCAT13(local_120.type._3_1_,2);
    local_120.text.ss = (StringStorage *)CONCAT44(local_120.text.ss._4_4_,iVar3);
    Value::operator=((Value *)this,(Value *)&local_120);
    if ((2 < (byte)(undefined1)local_120.type) && (local_120.text.ss != (StringStorage *)0x0)) {
      plVar2 = &((local_120.text.ss)->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((local_120.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_120.text.ss = (StringStorage *)0x0;
    }
    Lexer::Peek(&local_120,(Lexer *)local_160);
    local_e8.type = local_120.type;
    String::operator=(&local_e8.text,&local_120.text);
    local_e8.afterSpace = local_120.afterSpace;
    aVar6 = extraout_RDX_01;
    if ((local_120.text.ss != (StringStorage *)0x0) && (local_120.text.isTemp == false)) {
      plVar2 = &((local_120.text.ss)->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*((local_120.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar6 = extraout_RDX_02;
      }
      local_120.text.ss = (StringStorage *)0x0;
    }
    if ((2 < local_170[0]) && (local_168 != (ListStorage<MiniScript::BackPatch> *)0x0)) {
      plVar2 = &(local_168->super_RefCountedStorage).refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_168->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar6 = extraout_RDX_03;
      }
      local_168 = (ListStorage<MiniScript::BackPatch> *)0x0;
    }
  }
  if ((local_e8.text.ss != (StringStorage *)0x0) && (local_e8.text.isTemp == false)) {
    plVar2 = &((local_e8.text.ss)->super_RefCountedStorage).refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((local_e8.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      aVar6 = extraout_RDX_04;
    }
  }
  VVar7.data.number = aVar6.number;
  VVar7._0_8_ = this;
  return VVar7;
}

Assistant:

Value Parser::ParseAddSub(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMultDiv;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);
		Token tok = tokens.Peek();
		while (tok.type == Token::Type::OpPlus ||
			   (tok.type == Token::Type::OpMinus
				&& (!statementStart || !tok.afterSpace  || tokens.isAtWhitespace()))) {
			tokens.Dequeue();

			AllowLineBreak(tokens); // allow a line break after a binary operator
				   
			val = FullyEvaluate(val);
			Value opB = (*this.*nextLevel)(tokens, false, false);
			int tempNum = output->nextTempNum++;
			output->Add(TACLine(Value::Temp(tempNum),
							   tok.type == Token::Type::OpPlus ? TACLine::Op::APlusB : TACLine::Op::AMinusB,
							   val, opB));
			val = Value::Temp(tempNum);
			
			tok = tokens.Peek();
		}
		return val;
	}